

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_ALG_ASYM_SCHEME_Unmarshal
                 (TPMI_ALG_ASYM_SCHEME *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  uint uVar1;
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_ALG_ASYM_SCHEME *target_local;
  
  target_local._4_4_ = UINT16_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    uVar1 = (uint)*target;
    if (uVar1 == 0x10) {
      if (flag == 0) {
        return 0x84;
      }
    }
    else if ((6 < uVar1 - 0x14) && (uVar1 != 0x1c)) {
      return 0x84;
    }
    target_local._4_4_ = 0;
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMI_ALG_ASYM_SCHEME_Unmarshal(TPMI_ALG_ASYM_SCHEME *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ALG_ECDH
        case TPM_ALG_ECDH:
#endif // ALG_ECDH
#if         ALG_ECMQV
        case TPM_ALG_ECMQV:
#endif // ALG_ECMQV
#if         ALG_ECDAA
        case TPM_ALG_ECDAA:
#endif // ALG_ECDAA
#if         ALG_RSASSA
        case TPM_ALG_RSASSA:
#endif // ALG_RSASSA
#if         ALG_RSAPSS
        case TPM_ALG_RSAPSS:
#endif // ALG_RSAPSS
#if         ALG_ECDSA
        case TPM_ALG_ECDSA:
#endif // ALG_ECDSA
#if         ALG_SM2
        case TPM_ALG_SM2:
#endif // ALG_SM2
#if         ALG_ECSCHNORR
        case TPM_ALG_ECSCHNORR:
#endif // ALG_ECSCHNORR
#if         ALG_RSAES
        case TPM_ALG_RSAES:
#endif // ALG_RSAES
#if         ALG_OAEP
        case TPM_ALG_OAEP:
#endif // ALG_OAEP
            break;
        case TPM_ALG_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}